

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent-client.c
# Opt level: O3

void agent_select_result(int fd,int event)

{
  _Bool _Var1;
  agent_pending_query *conn;
  int in_stack_ffffffffffffffec;
  int local_c;
  
  local_c = fd;
  if (event == 1) {
    conn = (agent_pending_query *)find234(agent_pending_queries,&local_c,agent_connfind);
    if (conn == (agent_pending_query *)0x0) {
      uxsel_del(in_stack_ffffffffffffffec);
    }
    else {
      _Var1 = agent_try_read(conn);
      if (_Var1) {
        (*conn->callback)(conn->callback_ctx,conn->retbuf,conn->retlen);
        conn->retbuf = (char *)0x0;
        agent_cancel_query(conn);
      }
    }
    return;
  }
  __assert_fail("event == SELECT_R",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/agent-client.c"
                ,0x6b,"void agent_select_result(int, int)");
}

Assistant:

static void agent_select_result(int fd, int event)
{
    agent_pending_query *conn;

    assert(event == SELECT_R);  /* not selecting for anything but R */

    conn = find234(agent_pending_queries, &fd, agent_connfind);
    if (!conn) {
        uxsel_del(fd);
        return;
    }

    if (!agent_try_read(conn))
        return;                /* more data to come */

    /*
     * We have now completed the agent query. Do the callback.
     */
    conn->callback(conn->callback_ctx, conn->retbuf, conn->retlen);
    /* Null out conn->retbuf, since ownership of that buffer has
     * passed to the callback. */
    conn->retbuf = NULL;
    agent_cancel_query(conn);
}